

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O3

void __thiscall converterApp::loadFile(converterApp *this,string *file)

{
  int iVar1;
  _Alloc_hider __nptr;
  char cVar2;
  istream *piVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  vector<convValue,std::allocator<convValue>> *this_00;
  char *in_R9;
  pointer *__ptr;
  pointer pcVar7;
  string line;
  string name;
  string shortname;
  double value;
  ifstream input;
  string local_2c8;
  undefined1 local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  AssertHelper local_268 [2];
  undefined1 local_258 [24];
  _Alloc_hider local_240;
  size_type local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)file,_S_in);
  lVar4 = *(long *)(local_238[0] - 0x18);
  local_2a8[0] = (internal)((abStack_218[lVar4] & 5) == 0);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_2a8[0]) {
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    this_00 = (vector<convValue,std::allocator<convValue>> *)&this->unit_conv;
    local_258._16_8_ = this_00;
    while( true ) {
      cVar2 = std::ios::widen((char)&local_2c8 + (char)lVar4 + -0x70);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2c8,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (local_2c8._M_string_length != 0) {
        cVar2 = (char)&local_2c8;
        std::__cxx11::string::find(cVar2,0x2e);
        lVar4 = std::__cxx11::string::find_first_not_of(cVar2,0x20);
        lVar4 = std::__cxx11::string::find_first_of((char *)&local_2c8,0x1777da,lVar4 + 1);
        std::__cxx11::string::substr((ulong)local_2a8,(ulong)&local_2c8);
        while (*(char *)((long)local_2a0 + CONCAT71(local_2a8._1_7_,local_2a8[0]) + -1) == ' ') {
          std::__cxx11::string::pop_back();
        }
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        if (local_2c8._M_dataplus._M_p[lVar4] == '[') {
          std::__cxx11::string::find(cVar2,0x5d);
          std::__cxx11::string::substr((ulong)local_268,(ulong)&local_2c8);
          std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
          this_00 = (vector<convValue,std::allocator<convValue>> *)local_258._16_8_;
          if (local_268[0].data_ != (AssertHelperData *)local_258) {
            operator_delete(local_268[0].data_,local_258._0_8_ + 1);
            this_00 = (vector<convValue,std::allocator<convValue>> *)local_258._16_8_;
          }
        }
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] - 0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2c8,cVar2);
        __nptr._M_p = local_2c8._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        *piVar5 = 0;
        pcVar7 = (pointer)strtod(__nptr._M_p,(char **)local_268);
        if (local_268[0].data_ == (AssertHelperData *)__nptr._M_p) {
          std::__throw_invalid_argument("stod");
LAB_00129131:
          uVar6 = std::__throw_out_of_range("stod");
          testing::internal::AssertHelper::~AssertHelper(local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                     local_2c8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_288._M_dataplus._M_p + 8))();
          }
          if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,local_2a0);
          }
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) goto LAB_00129131;
        local_240._M_p = pcVar7;
        std::vector<convValue,std::allocator<convValue>>::
        emplace_back<std::__cxx11::string&,std::__cxx11::string&,double&>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2a8,&local_288,(double *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2a8._1_7_,local_2a8[0]) != &local_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_2a8._1_7_,local_2a8[0]),
                          local_298._M_allocated_capacity + 1);
        }
      }
      lVar4 = *(long *)(local_238[0] - 0x18);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_2a8,(AssertionResult *)"input","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
               ,0x1f,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_268,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_288._M_dataplus._M_p + 8))();
    }
    if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2a0,local_2a0);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void loadFile(const std::string& file)
    {
        std::ifstream input(file);
        ASSERT_TRUE(input);
        std::string line;
        while (std::getline(input, line)) {
            if (line.empty()) {
                continue;
            }
            auto ploc = line.find_first_of('.');
            auto namestartloc = line.find_first_not_of(' ', ploc + 1);
            auto nameend = line.find_first_of("[:", namestartloc + 1);
            std::string name =
                line.substr(namestartloc, nameend - namestartloc);
            while (name.back() == ' ') {
                name.pop_back();
            }
            std::string shortname;
            if (line[nameend] == '[') {
                auto snameend = line.find_first_of(']', nameend + 1);
                shortname = line.substr(nameend + 1, snameend - nameend - 1);
            }
            std::getline(input, line);
            double value = stod(line);
            unit_conv.emplace_back(name, shortname, value);
        }
    }